

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

char * unescape_word(Curl_easy *data,char *inputbuff)

{
  byte *pbVar1;
  int iVar2;
  undefined8 in_RAX;
  byte *pbVar3;
  char *pcVar4;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  int len;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  pcVar4 = (char *)0x0;
  pbVar3 = (byte *)curl_easy_unescape(data,inputbuff,0,&local_14);
  if (pbVar3 != (byte *)0x0) {
    pcVar4 = (char *)(*Curl_cmalloc)((long)local_14 * 2 + 1);
    if (pcVar4 != (char *)0x0) {
      bVar6 = *pbVar3;
      uVar5 = 0;
      pbVar1 = pbVar3;
      if (bVar6 != 0) {
        do {
          iVar2 = (int)uVar5;
          if (((byte)(bVar6 + 0x81) < 0xa2) ||
             ((bVar6 - 0x22 < 0x3b &&
              ((0x400000000000021U >> ((ulong)(bVar6 - 0x22) & 0x3f) & 1) != 0)))) {
            lVar7 = (long)iVar2;
            iVar2 = iVar2 + 1;
            pcVar4[lVar7] = '\\';
          }
          uVar5 = (ulong)(iVar2 + 1U);
          pcVar4[iVar2] = bVar6;
          bVar6 = pbVar1[1];
          pbVar1 = pbVar1 + 1;
        } while (bVar6 != 0);
        uVar5 = (ulong)(int)(iVar2 + 1U);
      }
      pcVar4[uVar5] = '\0';
    }
    (*Curl_cfree)(pbVar3);
  }
  return pcVar4;
}

Assistant:

static char *unescape_word(struct Curl_easy *data, const char *inputbuff)
{
  char *newp;
  char *dictp;
  char *ptr;
  int len;
  char ch;
  int olen=0;

  newp = curl_easy_unescape(data, inputbuff, 0, &len);
  if(!newp)
    return NULL;

  dictp = malloc(((size_t)len)*2 + 1); /* add one for terminating zero */
  if(dictp) {
    /* According to RFC2229 section 2.2, these letters need to be escaped with
       \[letter] */
    for(ptr = newp;
        (ch = *ptr) != 0;
        ptr++) {
      if((ch <= 32) || (ch == 127) ||
          (ch == '\'') || (ch == '\"') || (ch == '\\')) {
        dictp[olen++] = '\\';
      }
      dictp[olen++] = ch;
    }
    dictp[olen]=0;
  }
  free(newp);
  return dictp;
}